

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          ClassNameResolver *name_resolver,bool boxed)

{
  JavaType JVar1;
  Descriptor *descriptor;
  string *psVar2;
  EnumDescriptor *descriptor_00;
  char *pcVar3;
  allocator local_21;
  
  JVar1 = GetJavaType((FieldDescriptor *)this);
  if (JVar1 == JAVATYPE_MESSAGE) {
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)this);
    psVar2 = ClassNameResolver::GetClassName_abi_cxx11_
                       (__return_storage_ptr__,(ClassNameResolver *)field,descriptor,true);
    return psVar2;
  }
  JVar1 = GetJavaType((FieldDescriptor *)this);
  if (JVar1 == JAVATYPE_ENUM) {
    descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    psVar2 = ClassNameResolver::GetClassName_abi_cxx11_
                       (__return_storage_ptr__,(ClassNameResolver *)field,descriptor_00,true);
    return psVar2;
  }
  JVar1 = GetJavaType((FieldDescriptor *)this);
  if ((char)name_resolver == '\0') {
    pcVar3 = PrimitiveTypeName(JVar1);
  }
  else {
    pcVar3 = BoxedPrimitiveTypeName(JVar1);
  }
  psVar2 = (string *)std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_21)
  ;
  return psVar2;
}

Assistant:

std::string TypeName(const FieldDescriptor* field,
                     ClassNameResolver* name_resolver, bool boxed) {
  if (GetJavaType(field) == JAVATYPE_MESSAGE) {
    return name_resolver->GetImmutableClassName(field->message_type());
  } else if (GetJavaType(field) == JAVATYPE_ENUM) {
    return name_resolver->GetImmutableClassName(field->enum_type());
  } else {
    return boxed ? BoxedPrimitiveTypeName(GetJavaType(field))
                 : PrimitiveTypeName(GetJavaType(field));
  }
}